

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O2

void __thiscall reverselock_tests::reverselock_basics::test_method(reverselock_basics *this)

{
  long lVar1;
  iterator pvVar2;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar4;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  assertion_result local_160;
  char **local_148;
  assertion_result local_140;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  Mutex mutex;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  reverse_lock revlock4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutex.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  mutex.super_mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pvVar2 = (iterator)0x11;
  pvVar3 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&lock,&mutex,"mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x11,false);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x13;
  file.m_begin = (iterator)&local_e8;
  msg.m_end = pvVar3;
  msg.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)lock.super_unique_lock._M_owns;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  revlock4.lockname._M_dataplus._M_p = (pointer)&local_140;
  local_140._0_8_ = "lock.owns_lock()";
  local_140.m_message.px = (element_type *)0xbd0f15;
  revlock4.templock.super_unique_lock._M_device._0_1_ = 0;
  revlock4.lock = (UniqueLock<AnnotatedMixin<std::mutex>_> *)&PTR__lazy_ostream_011481f0;
  revlock4.templock.super_unique_lock._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_100 = "";
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)&revlock4,1,0,WARN,_cVar4,(size_t)&local_108,0x13);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  pvVar2 = (iterator)0x15;
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            (&revlock4,&lock,"lock",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x15);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x16;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_140._0_8_ = CONCAT71(local_140._1_7_,lock.super_unique_lock._M_owns) ^ 1;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148 = &local_170;
  local_170 = "!lock.owns_lock()";
  local_168 = "";
  local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
  local_160._0_8_ = &PTR__lazy_ostream_011481f0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_178 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_160,1,0,WARN,_cVar4,(size_t)&local_180,0x16);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(&revlock4);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x18;
  file_01.m_begin = (iterator)&local_190;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a0,
             msg_01);
  local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)lock.super_unique_lock._M_owns;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ = "lock.owns_lock()";
  local_140.m_message.px = (element_type *)0xbd0f15;
  revlock4.templock.super_unique_lock._M_device._0_1_ = 0;
  revlock4.lock = (UniqueLock<AnnotatedMixin<std::mutex>_> *)&PTR__lazy_ostream_011481f0;
  revlock4.templock.super_unique_lock._8_8_ = boost::unit_test::lazy_ostream::inst;
  revlock4.lockname._M_dataplus._M_p = (pointer)&local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)&revlock4,1,0,WARN,0xbd0e8d,(size_t)&stack0xfffffffffffffe50
             ,0x18);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_basics)
{
    Mutex mutex;
    WAIT_LOCK(mutex, lock);

    BOOST_CHECK(lock.owns_lock());
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
    }
    BOOST_CHECK(lock.owns_lock());
}